

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

UnionState * __thiscall
capnp::_::(anonymous_namespace)::
initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__50>
          (UnionState *__return_storage_ptr__,_anonymous_namespace_ *this,
          anon_class_1_0_00000001 *initializer)

{
  Builder b;
  initializer_list<unsigned_int> discriminants_00;
  ArrayDisposer *this_00;
  ArrayPtr<const_capnp::word> *pAVar1;
  size_t sVar2;
  word *pwVar3;
  word *pwVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  uint local_1a8;
  uint local_1a4;
  uint local_1a0;
  uint local_19c;
  iterator local_198;
  undefined8 local_190;
  word *local_188;
  uint8_t *discriminants;
  word *pwStack_178;
  uint8_t bits;
  uint8_t *p;
  size_t sStack_168;
  int offset;
  Fault local_160;
  Fault f;
  undefined1 local_148 [8];
  ArrayPtr<const_capnp::word> segment;
  Builder local_128;
  undefined1 local_100 [8];
  MallocMessageBuilder builder;
  anon_class_1_0_00000001 *initializer_local;
  
  builder.moreSegments.builder.disposer = (ArrayDisposer *)this;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_100,0x400,GROW_HEURISTICALLY);
  this_00 = builder.moreSegments.builder.disposer;
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestUnion>
            (&local_128,(MessageBuilder *)local_100);
  b._builder.capTable = local_128._builder.capTable;
  b._builder.segment = local_128._builder.segment;
  b._builder.data = local_128._builder.data;
  b._builder.pointers = local_128._builder.pointers;
  b._builder.dataSize = local_128._builder.dataSize;
  b._builder.pointerCount = local_128._builder.pointerCount;
  b._builder._38_2_ = local_128._builder._38_2_;
  anon_unknown_0::TestCase194::run::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this_00,b);
  AVar5 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_100);
  f.exception = (Exception *)AVar5.ptr;
  pAVar1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0);
  local_148 = (undefined1  [8])pAVar1->ptr;
  segment.ptr = (word *)pAVar1->size_;
  sVar2 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)local_148);
  if (sVar2 < 3) {
    sStack_168 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)local_148);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long>
              (&local_160,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0xaa,FAILED,"segment.size() > 2","segment.size()",&stack0xfffffffffffffe98);
    kj::_::Debug::Fault::fatal(&local_160);
  }
  p._4_4_ = 0;
  pwStack_178 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)local_148);
  pwStack_178 = pwStack_178 + 2;
  do {
    pwVar4 = pwStack_178;
    pwVar3 = kj::ArrayPtr<const_capnp::word>::end((ArrayPtr<const_capnp::word> *)local_148);
    if (pwVar3 <= pwVar4) {
      p._4_4_ = -1;
LAB_002c6220:
      pwVar4 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)local_148);
      local_188 = pwVar4 + 1;
      local_1a8 = (uint)(byte)local_188->content;
      local_1a4 = (uint)*(byte *)((long)&pwVar4[1].content + 2);
      local_1a0 = (uint)*(byte *)((long)&pwVar4[1].content + 4);
      local_19c = (uint)*(byte *)((long)&pwVar4[1].content + 6);
      local_198 = &local_1a8;
      local_190 = 4;
      discriminants_00._M_len = 4;
      discriminants_00._M_array = local_198;
      anon_unknown_0::UnionState::UnionState(__return_storage_ptr__,discriminants_00,p._4_4_);
      MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_100);
      return __return_storage_ptr__;
    }
    if ((char)pwStack_178->content != '\0') {
      for (discriminants._7_1_ = (byte)pwStack_178->content; (discriminants._7_1_ & 1) == 0;
          discriminants._7_1_ = (byte)((int)(uint)discriminants._7_1_ >> 1)) {
        p._4_4_ = p._4_4_ + 1;
      }
      goto LAB_002c6220;
    }
    p._4_4_ = p._4_4_ + 8;
    pwStack_178 = (word *)((long)&pwStack_178->content + 1);
  } while( true );
}

Assistant:

UnionState initUnion(Func&& initializer) {
  // Use the given setter to initialize the given union field and then return a struct indicating
  // the location of the data that was written as well as the values of the four union
  // discriminants.

  MallocMessageBuilder builder;
  initializer(builder.getRoot<StructType>());
  kj::ArrayPtr<const word> segment = builder.getSegmentsForOutput()[0];

  KJ_ASSERT(segment.size() > 2, segment.size());

  // Find the offset of the first set bit after the union discriminants.
  int offset = 0;
  for (const uint8_t* p = reinterpret_cast<const uint8_t*>(segment.begin() + 2);
       p < reinterpret_cast<const uint8_t*>(segment.end()); p++) {
    if (*p != 0) {
      uint8_t bits = *p;
      while ((bits & 1) == 0) {
        ++offset;
        bits >>= 1;
      }
      goto found;
    }
    offset += 8;
  }
  offset = -1;

found:
  const uint8_t* discriminants = reinterpret_cast<const uint8_t*>(segment.begin() + 1);
  return UnionState({discriminants[0], discriminants[2], discriminants[4], discriminants[6]},
                    offset);
}